

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  int iVar1;
  long in_RDI;
  SectionInfo *in_stack_ffffffffffffff08;
  StreamingReporterBase *in_stack_ffffffffffffff10;
  allocator *paVar2;
  string *in_stack_ffffffffffffff48;
  string local_b0 [16];
  string *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  XmlWriter *in_stack_ffffffffffffff70;
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  StreamingReporterBase::sectionStarting(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  iVar1 = *(int *)(in_RDI + 0x220);
  *(int *)(in_RDI + 0x220) = iVar1 + 1;
  if (0 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,"Section",&local_31);
    XmlWriter::startElement((XmlWriter *)in_stack_ffffffffffffff10,&in_stack_ffffffffffffff08->name)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"name",&local_69);
    trim(in_stack_ffffffffffffff48);
    XmlWriter::writeAttribute
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    paVar2 = (allocator *)&stack0xffffffffffffff4f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"description",paVar2);
    XmlWriter::writeAttribute
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  return;
}

Assistant:

virtual void sectionStarting( SectionInfo const& sectionInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::sectionStarting( sectionInfo );
            if( m_sectionDepth++ > 0 ) {
                m_xml.startElement( "Section" )
                    .writeAttribute( "name", trim( sectionInfo.name ) )
                    .writeAttribute( "description", sectionInfo.description );
            }
        }